

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LzmaEnc.cpp
# Opt level: O0

void crnlib::LenPriceEnc_UpdateTable(CLenPriceEnc *p,UInt32 posState,UInt32 *ProbPrices)

{
  UInt32 *ProbPrices_local;
  UInt32 posState_local;
  CLenPriceEnc *p_local;
  
  LenEnc_SetPrices(&p->p,posState,p->tableSize,p->prices[posState],ProbPrices);
  p->counters[posState] = p->tableSize;
  return;
}

Assistant:

static void MY_FAST_CALL LenPriceEnc_UpdateTable(CLenPriceEnc* p, UInt32 posState, UInt32* ProbPrices) {
  LenEnc_SetPrices(&p->p, posState, p->tableSize, p->prices[posState], ProbPrices);
  p->counters[posState] = p->tableSize;
}